

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Utilities.h
# Opt level: O3

void __thiscall
soul::heart::Utilities::
GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>
::check(GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>
        *this,Node *node,
       vector<const_soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node_*,_std::allocator<const_soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node_*>_>
       *visitedStack,CodeLocation *errorContext)

{
  Source *pSVar1;
  pointer pNVar2;
  ArrayWithPreallocation<soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node::Source,_4UL>
  *pAVar3;
  __normal_iterator<const_soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node_**,_std::vector<const_soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node_*,_std::allocator<const_soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node_*>_>_>
  _Var4;
  Source *source;
  pointer pNVar5;
  ArrayView<const_soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node_*>
  stack;
  Node *local_20;
  
  local_20 = (Node *)this;
  _Var4 = std::
          __find_if<__gnu_cxx::__normal_iterator<soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,soul::heart::ProcessorInstance,soul::heart::Connection,soul::CodeLocation>::Node_const**,std::vector<soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,soul::heart::ProcessorInstance,soul::heart::Connection,soul::CodeLocation>::Node_const*,std::allocator<soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,soul::heart::ProcessorInstance,soul::heart::Connection,soul::CodeLocation>::Node_const*>>>,__gnu_cxx::__ops::_Iter_equals_val<soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,soul::heart::ProcessorInstance,soul::heart::Connection,soul::CodeLocation>::Node_const*const>>
                    (node->processor,(node->sources).items);
  pSVar1 = (node->sources).items;
  if ((Source *)_Var4._M_current != pSVar1) {
    stack.e = (Node **)visitedStack;
    stack.s = &pSVar1->node;
    throwCycleError((GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>
                     *)node->processor,stack,errorContext);
  }
  local_20 = (Node *)this;
  std::
  vector<soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,soul::heart::ProcessorInstance,soul::heart::Connection,soul::CodeLocation>::Node_const*,std::allocator<soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,soul::heart::ProcessorInstance,soul::heart::Connection,soul::CodeLocation>::Node_const*>>
  ::
  emplace_back<soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,soul::heart::ProcessorInstance,soul::heart::Connection,soul::CodeLocation>::Node_const*>
            ((vector<soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,soul::heart::ProcessorInstance,soul::heart::Connection,soul::CodeLocation>::Node_const*,std::allocator<soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,soul::heart::ProcessorInstance,soul::heart::Connection,soul::CodeLocation>::Node_const*>>
              *)node,&local_20);
  pNVar2 = (this->nodes).
           super__Vector_base<soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node,_std::allocator<soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  if (pNVar2 != (pointer)0x0) {
    pNVar5 = (this->nodes).
             super__Vector_base<soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node,_std::allocator<soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pAVar3 = &pNVar5->sources;
    do {
      check((GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>
             *)pNVar5->processor,node,
            (vector<const_soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node_*,_std::allocator<const_soul::heart::Utilities::GraphTraversalHelper<soul::heart::Utilities::CycleDetector,_soul::heart::ProcessorInstance,_soul::heart::Connection,_soul::CodeLocation>::Node_*>_>
             *)&((pNVar5->sources).items)->connection,errorContext);
      pNVar5 = (pointer)&(pNVar5->sources).numActive;
    } while (pNVar5 != (pointer)(pAVar3->space + (long)pNVar2 * 2 + -4));
  }
  (node->sources).items = (Source *)&(node->sources).items[-1].connection;
  return;
}

Assistant:

static void check (const Node& node, std::vector<const Node*>& visitedStack, const ContextType& errorContext)
        {
            if (std::find (visitedStack.begin(), visitedStack.end(), std::addressof (node)) != visitedStack.end())
                throwCycleError (visitedStack, errorContext);

            visitedStack.push_back (std::addressof (node));

            for (auto& source : node.sources)
                check (source.node, visitedStack, Subclass::getContext (source.connection));

            visitedStack.pop_back();
        }